

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.h
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
date::detail::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *os,
          decimal_format_seconds<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_6U> *x)

{
  long lVar1;
  char cVar2;
  ostream *poVar3;
  numpunct *pnVar4;
  save_stream<char,_std::char_traits<char>_> _;
  locale local_40 [8];
  save_stream<char,_std::char_traits<char>_> local_38;
  
  save_stream<char,_std::char_traits<char>_>::save_stream(&local_38,os);
  lVar1 = *(long *)(*(long *)os + -0x18);
  std::ios::fill();
  os[lVar1 + 0xe0] = (basic_ostream<char,_std::char_traits<char>_>)0x30;
  lVar1 = *(long *)os;
  *(undefined4 *)(os + *(long *)(lVar1 + -0x18) + 0x18) = 0x82;
  *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 0x10) = 2;
  poVar3 = std::ostream::_M_insert<long>((long)os);
  std::locale::locale(local_40,(locale *)(os + *(long *)(*(long *)os + -0x18) + 0xd0));
  pnVar4 = std::use_facet<std::__cxx11::numpunct<char>>(local_40);
  cVar2 = (**(code **)(*(long *)pnVar4 + 0x10))(pnVar4);
  std::operator<<(poVar3,cVar2);
  std::locale::~locale(local_40);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 6;
  std::ostream::_M_insert<long>((long)os);
  save_stream<char,_std::char_traits<char>_>::~save_stream(&local_38);
  return os;
}

Assistant:

std::basic_ostream<CharT, Traits>&
    operator<<(std::basic_ostream<CharT, Traits>& os, const decimal_format_seconds& x)
    {
        date::detail::save_stream<CharT, Traits> _(os);
        os.fill('0');
        os.flags(std::ios::dec | std::ios::right);
        os.width(2);
        os << x.s_.count() <<
              std::use_facet<std::numpunct<char>>(os.getloc()).decimal_point();
        os.width(width);
        os << static_cast<std::int64_t>(x.sub_s_.count());
        return os;
    }